

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::CheckerInstanceBodySymbol::CheckerInstanceBodySymbol
          (CheckerInstanceBodySymbol *this,Compilation *compilation,CheckerSymbol *checker,
          AssertionInstanceDetails *assertionDetails,ASTContext *originalContext,
          uint32_t instanceDepth,bool isProcedural,bitmask<slang::ast::InstanceFlags> flags)

{
  Scope *scope;
  size_t in_RCX;
  Symbol *in_RDX;
  Symbol *in_RDI;
  void *in_R8;
  undefined4 in_R9D;
  byte in_stack_00000008;
  Scope *parent;
  SymbolIndex index;
  Compilation *in_stack_ffffffffffffffa8;
  SourceLocation location;
  
  location = in_RDX->location;
  Symbol::Symbol(in_RDI,CheckerInstanceBody,in_RDX->name,location);
  Scope::Scope((Scope *)location,in_stack_ffffffffffffffa8,in_RDI);
  in_RDI[1].originatingSyntax = (SyntaxNode *)0x0;
  *(Symbol **)(in_RDI + 2) = in_RDX;
  in_RDI[2].name._M_len = in_RCX;
  *(undefined4 *)&in_RDI[2].name._M_str = in_R9D;
  *(byte *)((long)&in_RDI[2].name._M_str + 4) = in_stack_00000008 & 1;
  *(undefined1 *)((long)&in_RDI[2].name._M_str + 5) = parent._0_1_;
  memcpy(&in_RDI[2].location,in_R8,0x38);
  *(SourceLocation **)(in_RCX + 8) = &in_RDI[2].location;
  scope = Symbol::getParentScope(in_RDX);
  index = (SymbolIndex)((ulong)in_RDI >> 0x20);
  Symbol::getIndex(in_RDX);
  Symbol::setParent((Symbol *)location,scope,index);
  return;
}

Assistant:

CheckerInstanceBodySymbol::CheckerInstanceBodySymbol(Compilation& compilation,
                                                     const CheckerSymbol& checker,
                                                     AssertionInstanceDetails& assertionDetails,
                                                     const ASTContext& originalContext,
                                                     uint32_t instanceDepth, bool isProcedural,
                                                     bitmask<InstanceFlags> flags) :
    Symbol(SymbolKind::CheckerInstanceBody, checker.name, checker.location),
    Scope(compilation, this), checker(checker), assertionDetails(assertionDetails),
    instanceDepth(instanceDepth), isProcedural(isProcedural), flags(flags),
    originalContext(originalContext) {

    assertionDetails.prevContext = &this->originalContext;

    auto parent = checker.getParentScope();
    SLANG_ASSERT(parent);
    setParent(*parent, checker.getIndex());
}